

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.cpp
# Opt level: O1

void __thiscall
CMU462::DynamicScene::Skeleton::drag
          (Skeleton *this,double x,double y,double dx,double dy,Matrix4x4 *modelViewProj)

{
  double dVar1;
  Vector4D q;
  Vector4D local_e8;
  double local_c0;
  double dStack_b8;
  double local_b0;
  double dStack_a8;
  Matrix4x4 local_a0;
  
  local_e8.x = (this->super_SceneObject).position.x;
  local_e8.y = (this->super_SceneObject).position.y;
  local_e8.z = (this->super_SceneObject).position.z;
  local_e8.w = 1.0;
  Matrix4x4::operator*(modelViewProj,&local_e8);
  dVar1 = 1.0 / local_a0.entries[0].w;
  local_e8.x = (local_a0.entries[0].x * dVar1 + dx) * local_a0.entries[0].w;
  local_e8.y = (local_a0.entries[0].y * dVar1 + dy) * local_a0.entries[0].w;
  local_e8.z = dVar1 * local_a0.entries[0].z * local_a0.entries[0].w;
  local_e8.w = local_a0.entries[0].w * dVar1 * local_a0.entries[0].w;
  Matrix4x4::inv(&local_a0,modelViewProj);
  Matrix4x4::operator*(&local_a0,&local_e8);
  local_e8.z = local_b0;
  local_e8.w = dStack_a8;
  local_e8.x = local_c0;
  local_e8.y = dStack_b8;
  Vector4D::to3D(&local_e8);
  (this->super_SceneObject).position.z = local_a0.entries[0].z;
  (this->super_SceneObject).position.x = local_a0.entries[0].x;
  (this->super_SceneObject).position.y = local_a0.entries[0].y;
  return;
}

Assistant:

void Skeleton::drag(double x, double y, double dx, double dy, const Matrix4x4& modelViewProj)
  {
    Vector4D q(position, 1.);

    // Transform into clip space
    q = modelViewProj * q;
    double w = q.w;
    q /= w;

    // Shift by (dx, dy).
    q.x += dx;
    q.y += dy;

    // Transform back into model space
    q *= w;
    q = modelViewProj.inv() * q;

    position = q.to3D();
  }